

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall bssl::anon_unknown_0::SSLVersionTest::SSLVersionTest(SSLVersionTest *this)

{
  SSLVersionTest *this_local;
  
  testing::TestWithParam<bssl::(anonymous_namespace)::VersionParam>::TestWithParam
            (&this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>);
  (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test =
       (_func_int **)&PTR__SSLVersionTest_006430e0;
  (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).
  super_WithParamInterface<bssl::(anonymous_namespace)::VersionParam>._vptr_WithParamInterface =
       (_func_int **)&PTR__SSLVersionTest_00643120;
  this->shed_handshake_config_ = true;
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&this->client_);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&this->server_);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&this->server_ctx_);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&this->client_ctx_);
  GetTestCertificate();
  GetTestKey();
  return;
}

Assistant:

SSLVersionTest() : cert_(GetTestCertificate()), key_(GetTestKey()) {}